

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesElementWildcard.cpp
# Opt level: O0

bool xercesc_4_0::XercesElementWildcard::wildcardIntersect
               (NodeTypes t1,uint w1,NodeTypes t2,uint w2)

{
  bool local_1e;
  bool local_1d;
  uint w2_local;
  NodeTypes t2_local;
  uint w1_local;
  NodeTypes t1_local;
  
  if (((t1 & (Any_NS|Any_Other)) == Any) || ((t2 & (Any_NS|Any_Other)) == Any)) {
    w1_local._3_1_ = true;
  }
  else if (((t1 & (Any_NS|Any_Other)) == Any_NS) && ((t2 & (Any_NS|Any_Other)) == Any_NS)) {
    w1_local._3_1_ = w1 == w2;
  }
  else if (((t1 & (Any_NS|Any_Other)) == Any_Other) && ((t2 & (Any_NS|Any_Other)) == Any_Other)) {
    w1_local._3_1_ = true;
  }
  else if (((t1 & (Any_NS|Any_Other)) == Any_NS) && ((t2 & (Any_NS|Any_Other)) == Any_Other)) {
    local_1d = w1 != w2 && w1 != 1;
    w1_local._3_1_ = local_1d;
  }
  else if (((t1 & (Any_NS|Any_Other)) == Any_Other) && ((t2 & (Any_NS|Any_Other)) == Any_NS)) {
    local_1e = w1 != w2 && w2 != 1;
    w1_local._3_1_ = local_1e;
  }
  else {
    w1_local._3_1_ = false;
  }
  return w1_local._3_1_;
}

Assistant:

bool XercesElementWildcard::wildcardIntersect(ContentSpecNode::NodeTypes t1,
                                              unsigned int               w1,
                                              ContentSpecNode::NodeTypes t2,
                                              unsigned int               w2)
{
    if (((t1 & 0x0f) == ContentSpecNode::Any) ||
        ((t2 & 0x0f) == ContentSpecNode::Any)) {
        // if either one is "##any", then intersects
        return true;
    }
    else if (((t1 & 0x0f) == ContentSpecNode::Any_NS) &&
             ((t2 & 0x0f) == ContentSpecNode::Any_NS)) {
        // if both are "some_namespace" and equal, then intersects
        return w1 == w2;
    }
    else if (((t1 & 0x0f) == ContentSpecNode::Any_Other) &&
             ((t2 & 0x0f) == ContentSpecNode::Any_Other)) {
        // if both are "##other", then intersects
        return true;
    }
    // Below we assume that empty string has id 1.
    //
    else if (((t1 & 0x0f) == ContentSpecNode::Any_NS) &&
             ((t2 & 0x0f) == ContentSpecNode::Any_Other))
    {
      return w1 != w2 && w1 != 1;
    }
    else if (((t1 & 0x0f) == ContentSpecNode::Any_Other) &&
             ((t2 & 0x0f) == ContentSpecNode::Any_NS))
    {
      return w1 != w2 && w2 != 1;
    }
    return false;
}